

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::AssignDescriptors
               (string *filename,MigrationSchema *schemas,Message **default_instances_,
               uint32 *offsets,MessageFactory *factory,Metadata *file_level_metadata,
               EnumDescriptor **file_level_enum_descriptors,
               ServiceDescriptor **file_level_service_descriptors)

{
  bool bVar1;
  int iVar2;
  DescriptorPool *this;
  LogMessage *other;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  FileOptions *this_00;
  ServiceDescriptor *pSVar3;
  int local_cc;
  int local_c8;
  int i_2;
  int i_1;
  int i;
  AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema> helper;
  LogMessage local_78;
  FileDescriptor *local_40;
  FileDescriptor *file;
  Metadata *file_level_metadata_local;
  MessageFactory *factory_local;
  uint32 *offsets_local;
  Message **default_instances__local;
  MigrationSchema *schemas_local;
  string *filename_local;
  
  file = (FileDescriptor *)file_level_metadata;
  file_level_metadata_local = (Metadata *)factory;
  factory_local = (MessageFactory *)offsets;
  offsets_local = (uint32 *)default_instances_;
  default_instances__local = (Message **)schemas;
  schemas_local = (MigrationSchema *)filename;
  this = DescriptorPool::generated_pool();
  local_40 = DescriptorPool::FindFileByName(this,(string *)schemas_local);
  if (local_40 == (FileDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x908);
    other = LogMessage::operator<<(&local_78,"CHECK failed: file != NULL: ");
    LogFinisher::operator=((LogFinisher *)((long)&helper.offsets_ + 3),other);
    LogMessage::~LogMessage(&local_78);
  }
  if (file_level_metadata_local == (Metadata *)0x0) {
    file_level_metadata_local = (Metadata *)MessageFactory::generated_factory();
  }
  anon_unknown_0::AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema>::
  AssignDescriptorsHelper
            ((AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema> *)&i_1,
             (MessageFactory *)file_level_metadata_local,(Metadata *)file,
             file_level_enum_descriptors,(MigrationSchema *)default_instances__local,
             (Message **)offsets_local,(uint32 *)factory_local);
  for (i_2 = 0; iVar2 = FileDescriptor::message_type_count(local_40), i_2 < iVar2; i_2 = i_2 + 1) {
    descriptor = FileDescriptor::message_type(local_40,i_2);
    anon_unknown_0::AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema>::
    AssignMessageDescriptor
              ((AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema> *)&i_1,
               descriptor);
  }
  for (local_c8 = 0; iVar2 = FileDescriptor::enum_type_count(local_40), local_c8 < iVar2;
      local_c8 = local_c8 + 1) {
    descriptor_00 = FileDescriptor::enum_type(local_40,local_c8);
    anon_unknown_0::AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema>::
    AssignEnumDescriptor
              ((AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema> *)&i_1,
               descriptor_00);
  }
  this_00 = FileDescriptor::options(local_40);
  bVar1 = FileOptions::cc_generic_services(this_00);
  if (bVar1) {
    for (local_cc = 0; iVar2 = FileDescriptor::service_count(local_40), local_cc < iVar2;
        local_cc = local_cc + 1) {
      pSVar3 = FileDescriptor::service(local_40,local_cc);
      file_level_service_descriptors[local_cc] = pSVar3;
    }
  }
  return;
}

Assistant:

void AssignDescriptors(
    const string& filename, const MigrationSchema* schemas,
    const Message* const* default_instances_, const uint32* offsets,
    MessageFactory* factory,
    // update the following descriptor arrays.
    Metadata* file_level_metadata,
    const EnumDescriptor** file_level_enum_descriptors,
    const ServiceDescriptor** file_level_service_descriptors) {
  const ::google::protobuf::FileDescriptor* file =
      ::google::protobuf::DescriptorPool::generated_pool()->FindFileByName(filename);
  GOOGLE_CHECK(file != NULL);

  if (!factory) factory = MessageFactory::generated_factory();

  AssignDescriptorsHelper<MigrationSchema> helper(factory, file_level_metadata,
                                 file_level_enum_descriptors, schemas,
                                 default_instances_, offsets);

  for (int i = 0; i < file->message_type_count(); i++) {
    helper.AssignMessageDescriptor(file->message_type(i));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    helper.AssignEnumDescriptor(file->enum_type(i));
  }
  if (file->options().cc_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      file_level_service_descriptors[i] = file->service(i);
    }
  }
}